

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

size_t fmt::v11::detail::code_point_index(string_view s,size_t n)

{
  string_view s_00;
  size_t sVar1;
  char *in_RSI;
  size_t unaff_retaddr;
  anon_class_24_3_b33ccaaf_for_f in_stack_00000010;
  char *begin;
  size_t result;
  
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
  basic_string_view<char>::begin((basic_string_view<char> *)&stack0xfffffffffffffff0);
  s_00.size_ = unaff_retaddr;
  s_00.data_ = in_RSI;
  for_each_codepoint<fmt::v11::detail::code_point_index(fmt::v11::basic_string_view<char>,unsigned_long)::_lambda(unsigned_int,fmt::v11::basic_string_view<char>)_1_>
            (s_00,in_stack_00000010);
  return sVar1;
}

Assistant:

inline auto code_point_index(string_view s, size_t n) -> size_t {
  size_t result = s.size();
  const char* begin = s.begin();
  for_each_codepoint(s, [begin, &n, &result](uint32_t, string_view sv) {
    if (n != 0) {
      --n;
      return true;
    }
    result = to_unsigned(sv.begin() - begin);
    return false;
  });
  return result;
}